

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O0

ostream * wasm::operator<<(ostream *o,Literals *literals)

{
  bool bVar1;
  bool bVar2;
  size_t sVar3;
  Literal *other;
  Iterator IVar4;
  IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
  IVar5;
  Literal local_a0;
  value_type *local_88;
  value_type *literal;
  Iterator __end1;
  Iterator __begin1;
  Literals *__range1;
  undefined1 local_50 [7];
  bool first;
  undefined4 local_38;
  PrintLimiter local_21;
  Literals *pLStack_20;
  PrintLimiter limiter;
  Literals *literals_local;
  ostream *o_local;
  
  pLStack_20 = literals;
  anon_unknown_0::PrintLimiter::PrintLimiter(&local_21);
  bVar1 = anon_unknown_0::PrintLimiter::stop(&local_21);
  if (bVar1) {
    o_local = std::operator<<(o,"[..]");
  }
  else {
    sVar3 = SmallVector<wasm::Literal,_1UL>::size(&literals->super_SmallVector<wasm::Literal,_1UL>);
    if (sVar3 == 1) {
      other = SmallVector<wasm::Literal,_1UL>::operator[]
                        (&literals->super_SmallVector<wasm::Literal,_1UL>,0);
      Literal::Literal((Literal *)local_50,other);
      o_local = operator<<(o,(Literal *)local_50);
      Literal::~Literal((Literal *)local_50);
    }
    else {
      std::operator<<(o,'(');
      bVar1 = true;
      IVar4 = SmallVector<wasm::Literal,_1UL>::begin
                        (&literals->super_SmallVector<wasm::Literal,_1UL>);
      __end1.
      super_IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
      .index = (size_t)IVar4.
                       super_IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
                       .parent;
      IVar5 = (IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
               )SmallVector<wasm::Literal,_1UL>::end
                          (&literals->super_SmallVector<wasm::Literal,_1UL>);
      while( true ) {
        __end1.
        super_IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
        .parent = (SmallVector<wasm::Literal,_1UL> *)IVar5.index;
        literal = (value_type *)IVar5.parent;
        bVar2 = SmallVector<wasm::Literal,_1UL>::
                IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
                ::operator!=((IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
                              *)&__end1.
                                 super_IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
                                 .index,(Iterator *)&literal);
        if (!bVar2) break;
        local_88 = SmallVector<wasm::Literal,_1UL>::Iterator::operator*
                             ((Iterator *)
                              &__end1.
                               super_IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
                               .index);
        bVar2 = anon_unknown_0::PrintLimiter::stop(&local_21);
        if (bVar2) {
          std::operator<<(o,"[..]");
          break;
        }
        if (bVar1) {
          bVar1 = false;
        }
        else {
          std::operator<<(o,", ");
        }
        Literal::Literal(&local_a0,local_88);
        operator<<(o,&local_a0);
        Literal::~Literal(&local_a0);
        SmallVector<wasm::Literal,_1UL>::
        IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
        ::operator++((IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
                      *)&__end1.
                         super_IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
                         .index);
        IVar5.index = (size_t)__end1.
                              super_IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
                              .parent;
        IVar5.parent = (SmallVector<wasm::Literal,_1UL> *)literal;
      }
      o_local = std::operator<<(o,')');
    }
  }
  local_38 = 1;
  anon_unknown_0::PrintLimiter::~PrintLimiter(&local_21);
  return o_local;
}

Assistant:

std::ostream& operator<<(std::ostream& o, wasm::Literals literals) {
  PrintLimiter limiter;

  if (limiter.stop()) {
    return o << "[..]";
  }

  if (literals.size() == 1) {
    return o << literals[0];
  }

  o << '(';
  bool first = true;
  for (auto& literal : literals) {
    if (limiter.stop()) {
      o << "[..]";
      break;
    }
    if (first) {
      first = false;
    } else {
      o << ", ";
    }
    o << literal;
  }
  return o << ')';
}